

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

void sat_solver_set_var_activity(sat_solver *s,int *pVars,int nVars)

{
  int iVar1;
  word *pwVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  int *orderpos;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  if (0 < (long)s->size) {
    memset(s->activity,0,(long)s->size << 3);
  }
  if (s->VarActType == 1) {
    s->var_inc = 0x3ff0000000000000;
    if (0 < nVars) {
      pwVar2 = s->activity;
      piVar3 = s->orderpos;
      uVar8 = 0;
      do {
        iVar7 = (int)uVar8;
        if (pVars != (int *)0x0) {
          iVar7 = pVars[uVar8];
        }
        pwVar2[iVar7] = (word)(double)(nVars - (int)uVar8);
        uVar11 = piVar3[iVar7];
        uVar9 = (ulong)(int)uVar11;
        if (uVar9 != 0xffffffffffffffff) {
          piVar4 = (s->order).ptr;
          iVar7 = piVar4[uVar9];
          if (uVar11 != 0) {
            uVar5 = pwVar2[iVar7];
            do {
              uVar6 = (uint)uVar9;
              uVar10 = (int)((uVar6 - ((int)(uVar6 - 1) >> 0x1f)) + -1) >> 1;
              iVar1 = piVar4[(int)uVar10];
              uVar11 = uVar6;
              if (uVar5 <= pwVar2[iVar1]) break;
              piVar4[(int)uVar6] = iVar1;
              piVar3[iVar1] = uVar6;
              uVar9 = (ulong)uVar10;
              uVar11 = uVar10;
            } while (2 < uVar6);
          }
          piVar4[(int)uVar11] = iVar7;
          piVar3[iVar7] = uVar11;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != (uint)nVars);
    }
  }
  else {
    if (s->VarActType != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0xf5,"void sat_solver_set_var_activity(sat_solver *, int *, int)");
    }
    s->var_inc = 0x20;
    s->var_decay = 0xffffffffffffffff;
    if (0 < nVars) {
      pwVar2 = s->activity;
      piVar3 = s->orderpos;
      uVar8 = 0;
      do {
        if (pVars == (int *)0x0) {
          iVar7 = (int)uVar8;
        }
        else {
          iVar7 = pVars[uVar8];
        }
        pwVar2[iVar7] = ((uint)nVars - uVar8) * s->var_inc;
        uVar11 = piVar3[iVar7];
        uVar9 = (ulong)(int)uVar11;
        if (uVar9 != 0xffffffffffffffff) {
          piVar4 = (s->order).ptr;
          iVar7 = piVar4[uVar9];
          if (uVar11 != 0) {
            uVar5 = pwVar2[iVar7];
            do {
              uVar6 = (uint)uVar9;
              uVar10 = (int)((uVar6 - ((int)(uVar6 - 1) >> 0x1f)) + -1) >> 1;
              iVar1 = piVar4[(int)uVar10];
              uVar11 = uVar6;
              if (uVar5 <= pwVar2[iVar1]) break;
              piVar4[(int)uVar6] = iVar1;
              piVar3[iVar1] = uVar6;
              uVar9 = (ulong)uVar10;
              uVar11 = uVar10;
            } while (2 < uVar6);
          }
          piVar4[(int)uVar11] = iVar7;
          piVar3[iVar7] = uVar11;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != (uint)nVars);
    }
  }
  return;
}

Assistant:

void sat_solver_set_var_activity(sat_solver* s, int * pVars, int nVars) 
{
    int i;
    for (i = 0; i < s->size; i++)
        s->activity[i] = 0;
    if ( s->VarActType == 0 )
    {
        s->var_inc            = (1 <<  5);
        s->var_decay          = -1;
        for ( i = 0; i < nVars; i++ )
        {
            int iVar = pVars ? pVars[i] : i;
            s->activity[iVar] = s->var_inc*(nVars-i);
            if (s->orderpos[iVar] != -1)
                order_update( s, iVar );
        }
    }
    else if ( s->VarActType == 1 )
    {
        s->var_inc = Abc_Dbl2Word(1);
        for ( i = 0; i < nVars; i++ )
        {
            int iVar = pVars ? pVars[i] : i;
            s->activity[iVar] = Abc_Dbl2Word(nVars-i);
            if (s->orderpos[iVar] != -1)
                order_update( s, iVar );
        }
    }
    else assert( 0 );
}